

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpContext.cpp
# Opt level: O0

string * __thiscall xmrig::HttpContext::ip_abi_cxx11_(HttpContext *this)

{
  long in_RSI;
  string *in_RDI;
  int size;
  sockaddr_storage addr;
  char ip [46];
  allocator local_cd;
  undefined4 local_cc;
  short local_c8 [64];
  char local_48 [72];
  
  memset(local_48,0,0x2e);
  memset(local_c8,0,0x80);
  local_cc = 0x80;
  uv_tcp_getpeername(*(undefined8 *)(in_RSI + 0x88),local_c8,&local_cc);
  if (local_c8[0] == 10) {
    uv_ip6_name(local_c8,local_48,0x2d);
  }
  else {
    uv_ip4_name(local_c8,local_48,0x10);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(in_RDI,local_48,&local_cd);
  std::allocator<char>::~allocator((allocator<char> *)&local_cd);
  return in_RDI;
}

Assistant:

std::string xmrig::HttpContext::ip() const
{
    char ip[46]           = {};
    sockaddr_storage addr = {};
    int size              = sizeof(addr);

    uv_tcp_getpeername(m_tcp, reinterpret_cast<sockaddr*>(&addr), &size);
    if (reinterpret_cast<sockaddr_in *>(&addr)->sin_family == AF_INET6) {
        uv_ip6_name(reinterpret_cast<sockaddr_in6*>(&addr), ip, 45);
    }
    else {
        uv_ip4_name(reinterpret_cast<sockaddr_in*>(&addr), ip, 16);
    }

    return ip;
}